

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O2

void __thiscall fmcalc::init_policytc(fmcalc *this,int maxRunLevel)

{
  int i;
  int iVar1;
  fm_policyTC *f_00;
  vector<fm_policyTC,_std::allocator<fm_policyTC>_> p;
  fm_policyTC f;
  
  if (maxRunLevel != -1) {
    this->maxRunLevel_ = maxRunLevel;
  }
  p.super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  p.super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  p.super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  parse_policytc(this,&p);
  f.layer_id = 1;
  f.profile_id = -1;
  f.level_id = 0;
  for (iVar1 = 1;
      f_00 = p.super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>._M_impl.
             super__Vector_impl_data._M_start,
      iVar1 <= *(this->level_to_maxagg_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; iVar1 = iVar1 + 1) {
    f.agg_id = iVar1;
    addtcrow(this,&f);
  }
  for (; f_00 != p.super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>._M_impl.
                 super__Vector_impl_data._M_finish; f_00 = f_00 + 1) {
    addtcrow(this,f_00);
  }
  std::_Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>::~_Vector_base
            (&p.super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>);
  return;
}

Assistant:

void fmcalc::init_policytc(int maxRunLevel)
{
	if (maxRunLevel != -1) maxRunLevel_ = maxRunLevel;

	std::vector< fm_policyTC> p;
	parse_policytc(p);

	fm_policyTC f;
	f.layer_id = 1;
	f.level_id = 0;
	f.profile_id = -1;
	for (int i = 1; i <= level_to_maxagg_id_[0]; i++) {		
		f.agg_id = i;		
		addtcrow(f);
	}


	auto iter = p.begin();
	while (iter != p.end()) {
		addtcrow(*iter);
		iter++;
	}

}